

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateSmallDenseSeeds.cpp
# Opt level: O3

int main(void)

{
  undefined1 auVar1 [16];
  atomic<unsigned_int> aVar2;
  int iVar3;
  WirehairResult WVar4;
  uint32_t block_bytes;
  int iVar5;
  long lVar6;
  uint64_t uVar7;
  ostream *poVar8;
  long *plVar9;
  uint16_t d_seed;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  undefined4 uVar17;
  uint block_id;
  uint uVar18;
  uint uVar19;
  uint16_t *puVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  Codec decoder;
  Codec encoder;
  Codec codec;
  int local_fc64;
  int local_fc60;
  __atomic_base<unsigned_int> local_fc5c;
  __atomic_base<unsigned_int> local_fc50;
  Codec local_fc38;
  Codec local_fb38;
  Codec local_fa38 [250];
  
  auVar22 = vmovdqu64_avx512f(wirehair::kTinyDenseCounts._0_64_);
  auVar23 = vmovdqu64_avx512f(wirehair::kTinyDenseSeeds._0_64_);
  auVar24 = vmovdqu64_avx512f(wirehair::kTinyDenseSeeds._64_64_);
  kTinyDenseCounts[0x40] = '\x13';
  kTinyDenseCounts._0_64_ = vmovdqu64_avx512f(auVar22);
  kTinyDenseSeeds[0x40] = 0x76e;
  kTinyDenseSeeds._0_64_ = vmovdqu64_avx512f(auVar23);
  kTinyDenseSeeds._64_64_ = vmovdqu64_avx512f(auVar24);
  memcpy(kSmallDenseSeeds,wirehair::kSmallDenseSeeds,0x7bf);
  memcpy(kSmallPeelSeeds,wirehair::kSmallPeelSeeds,0x800);
  iVar3 = gf256_init_(2);
  if (iVar3 == 0) {
    auVar22 = vmovdqa64_avx512f(_DAT_00109040);
    auVar23 = vpbroadcastb_avx512bw(ZEXT116(0x40));
    lVar6 = 0;
    do {
      auVar24 = vmovdqu64_avx512f(auVar22);
      *(undefined1 (*) [64])(Message + lVar6) = auVar24;
      lVar6 = lVar6 + 0x40;
      auVar22 = vpaddb_avx512bw(auVar22,auVar23);
    } while (lVar6 != 64000);
    local_fc60 = 0;
    local_fc5c._M_i = 10000;
    iVar3 = 0xb;
    uVar7 = siamese::GetTimeUsec();
    local_fc64 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"For N = ",8);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," trying count = ",0x10);
      plVar9 = (long *)std::ostream::operator<<(poVar8,iVar3);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      iVar10 = 0;
      uVar14 = uVar7 * -0x4f5c17a566d501a4 + 0x8f5dc87e5c07d8a;
      uVar11 = uVar7 * -0x7e9ce66163b5a5d2 + 0x4214a66dea6f8745;
      do {
        uVar7 = uVar7 + 1;
        lVar6 = 0xdac;
        LOCK();
        FailedTrials.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0;
        UNLOCK();
        uVar12 = uVar11;
        uVar15 = uVar14;
        do {
          auVar25._8_8_ = 0;
          auVar25._0_8_ = uVar15;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = uVar12;
          auVar25 = vpunpcklqdq_avx(auVar21,auVar25);
          auVar21 = vpsrlvq_avx2(auVar25,_DAT_00109090);
          auVar1 = vpsrlvq_avx2(auVar25,_DAT_001090a0);
          auVar25 = vpsrlq_avx(auVar25,0x3b);
          auVar25 = vpshufd_avx(auVar25,0xe8);
          auVar21 = vpshufd_avx(auVar1 ^ auVar21,0xe8);
          auVar21 = vprorvd_avx512vl(auVar21,auVar25);
          auVar25 = vpshufd_avx(auVar21,0x55);
          uVar17 = vpextrw_avx(auVar21 ^ auVar25,0);
          wirehair::Codec::Codec(local_fa38);
          wirehair::Codec::OverrideSeeds
                    (local_fa38,(uint16_t)iVar3,(uint16_t)uVar17,(uint16_t)iVar10);
          WVar4 = wirehair::Codec::InitializeEncoder(local_fa38,0x11,1);
          if ((WVar4 != Wirehair_Success) ||
             (WVar4 = wirehair::Codec::EncodeFeed(local_fa38,Message), WVar4 != Wirehair_Success)) {
            LOCK();
            FailedTrials.super___atomic_base<unsigned_int>._M_i =
                 (__atomic_base<unsigned_int>)
                 ((int)FailedTrials.super___atomic_base<unsigned_int>._M_i + 1);
            UNLOCK();
          }
          wirehair::Codec::~Codec(local_fa38);
          aVar2 = FailedTrials;
          uVar15 = uVar15 + 0x5851f42d4c957f2d;
          uVar12 = uVar12 + 0x685f98a2018fade9;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
        if ((int)FailedTrials.super___atomic_base<unsigned_int>._M_i < (int)local_fc5c._M_i) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"*** New best dense: N = ",0x18);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,": Best dense seed = ",0x14);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", best count = ",0xf);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", best failures = ",0x12);
          plVar9 = (long *)std::ostream::operator<<
                                     (poVar8,(int)aVar2.super___atomic_base<unsigned_int>._M_i);
          std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
          std::ostream::put((char)plVar9);
          std::ostream::flush();
          local_fc5c = aVar2.super___atomic_base<unsigned_int>._M_i;
          local_fc64 = iVar10;
          local_fc60 = iVar3;
          if ((int)aVar2.super___atomic_base<unsigned_int>._M_i < 1) {
            break;
          }
        }
        iVar10 = iVar10 + 1;
        uVar14 = uVar14 + 0xb0a3e85a992afe5c;
        uVar11 = uVar11 + 0x8163199e9c4a5a2e;
      } while (iVar10 != 0x10000);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"N = ",4);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": Best dense seed = ",0x14);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_fc64);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", best count = ",0xf);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_fc60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", best failures = ",0x12);
    plVar9 = (long *)std::ostream::operator<<(poVar8,local_fc5c._M_i);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    local_fc50._M_i = 100000;
    iVar10 = 0;
    iVar3 = 0;
    do {
      LOCK();
      FailedTrials.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0;
      UNLOCK();
      uVar19 = 0;
      uVar18 = uVar19;
      do {
        wirehair::Codec::Codec(&local_fb38);
        wirehair::Codec::Codec(&local_fc38);
        d_seed = (uint16_t)local_fc64;
        wirehair::Codec::OverrideSeeds(&local_fb38,(uint16_t)local_fc60,(uint16_t)iVar10,d_seed);
        wirehair::Codec::OverrideSeeds(&local_fc38,(uint16_t)local_fc60,(uint16_t)iVar10,d_seed);
        WVar4 = wirehair::Codec::InitializeEncoder(&local_fb38,0x11,1);
        if ((WVar4 == Wirehair_Success) &&
           (WVar4 = wirehair::Codec::EncodeFeed(&local_fb38,Message), WVar4 == Wirehair_Success)) {
          WVar4 = wirehair::Codec::InitializeDecoder(&local_fc38,0x11,1);
          if (WVar4 != Wirehair_Success) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"InitializeDecoder failed",0x18);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
            std::ostream::put('h');
            std::ostream::flush();
            goto LAB_00101944;
          }
          uVar16 = 0;
          for (block_id = 0; uVar19 == block_id || uVar18 == block_id; block_id = block_id + 1) {
LAB_001019d0:
          }
          block_bytes = wirehair::Codec::Encode(&local_fb38,block_id,local_fa38,1);
          if (block_bytes == 0) {
            lVar6 = 0xd;
            pcVar13 = "Encode failed";
LAB_00101a0f:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,lVar6);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
            std::ostream::put('h');
            std::ostream::flush();
LAB_00101a4d:
            LOCK();
            FailedTrials.super___atomic_base<unsigned_int>._M_i =
                 (__atomic_base<unsigned_int>)
                 ((int)FailedTrials.super___atomic_base<unsigned_int>._M_i + 10000);
            UNLOCK();
          }
          else {
            WVar4 = wirehair::Codec::DecodeFeed(&local_fc38,block_id,local_fa38,block_bytes);
            if (WVar4 == Wirehair_NeedMore) {
              uVar16 = uVar16 + 1;
              if (block_id < 0x1c) goto LAB_001019d0;
              goto LAB_00101a4d;
            }
            lVar6 = 0x11;
            pcVar13 = "DecodeFeed failed";
            if (WVar4 != Wirehair_Success) goto LAB_00101a0f;
            if (uVar16 - 0x10 < 3) {
              iVar5 = *(int *)(&DAT_00109084 + (ulong)(uVar16 - 0x10) * 4);
            }
            else {
              iVar5 = 0;
              if (0x13 < uVar16 + 1) {
                iVar5 = uVar16 * 3 + -0x30;
              }
            }
            LOCK();
            FailedTrials.super___atomic_base<unsigned_int>._M_i =
                 (__atomic_base<unsigned_int>)
                 ((int)FailedTrials.super___atomic_base<unsigned_int>._M_i + iVar5);
            UNLOCK();
            WVar4 = wirehair::Codec::ReconstructOutput(&local_fc38,local_fa38,0x11);
            lVar6 = 0x18;
            pcVar13 = "ReconstructOutput failed";
            if (WVar4 != Wirehair_Success) {
LAB_00101ae8:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,pcVar13,lVar6);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
              std::ostream::put('h');
              std::ostream::flush();
              goto LAB_00101944;
            }
            lVar6 = 0xd;
            pcVar13 = "memcmp failed";
            auVar25 = vpternlogq_avx512vl(ZEXT116((byte)local_fa38[0]._d_seed ^ Message[0x10]),
                                          local_fa38[0]._0_16_,Message._0_16_,0xf6);
            if (auVar25 != (undefined1  [16])0x0) goto LAB_00101ae8;
          }
        }
        else {
LAB_00101944:
          LOCK();
          FailedTrials.super___atomic_base<unsigned_int>._M_i =
               (__atomic_base<unsigned_int>)
               ((int)FailedTrials.super___atomic_base<unsigned_int>._M_i + 10000);
          UNLOCK();
        }
        wirehair::Codec::~Codec(&local_fc38);
        wirehair::Codec::~Codec(&local_fb38);
        aVar2 = FailedTrials;
        uVar19 = uVar19 + 1;
      } while ((uVar19 != 0x11) || (uVar19 = uVar18 + 1, uVar18 = uVar19, uVar19 != 0x11));
      if ((int)FailedTrials.super___atomic_base<unsigned_int>._M_i < (int)local_fc50._M_i) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"*** New best peel: N = ",0x17);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": Best peel seed = ",0x13);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," fails = ",9);
        plVar9 = (long *)std::ostream::operator<<
                                   (poVar8,(int)aVar2.super___atomic_base<unsigned_int>._M_i);
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        std::ostream::flush();
        local_fc50 = aVar2.super___atomic_base<unsigned_int>._M_i;
        iVar3 = iVar10;
        if ((int)aVar2.super___atomic_base<unsigned_int>._M_i < 1) {
          break;
        }
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != 0x10000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"N = ",4);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": Best peel seed = ",0x13);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," fails = ",9);
    plVar9 = (long *)std::ostream::operator<<(poVar8,local_fc50._M_i);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    kSmallPeelSeeds[0x11] = (uint8_t)iVar3;
    kTinyDenseCounts[0x11] = (uint8_t)local_fc60;
    kTinyDenseSeeds[0x11] = d_seed;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"static const unsigned kTinyTableCount = ",0x28);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"static const unsigned kSmallTableCount = ",0x29);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"const uint8_t kTinyDenseCounts[kTinyTableCount] = {",0x33);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar11 = 0;
    do {
      if ((uVar11 & 0x1f) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
      }
      poVar8 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,(uint)kTinyDenseCounts[uVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
      uVar11 = uVar11 + 1;
      if ((uVar11 & 0x1f) == 0) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
        std::ostream::put('h');
        std::ostream::flush();
      }
    } while (uVar11 != 0x41);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"};",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    plVar9 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"const uint16_t kTinyDenseSeeds[kTinyTableCount] = {",0x33);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    puVar20 = kTinyDenseSeeds;
    uVar11 = 0;
    do {
      if ((uVar11 & 0x1f) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
      }
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)*puVar20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
      uVar11 = uVar11 + 1;
      if ((uVar11 & 0x1f) == 0) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
        std::ostream::put('h');
        std::ostream::flush();
      }
      puVar20 = puVar20 + 1;
    } while (uVar11 != 0x41);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"};",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"// This table skips the first kTinyTableCount elements",0x36);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"const uint8_t kSmallDenseSeeds[kSmallTableCount] = {",0x34);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar11 = 0;
    do {
      if ((uVar11 & 0x1f) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
      }
      poVar8 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,(uint)kSmallDenseSeeds[uVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
      uVar11 = uVar11 + 1;
      if ((uVar11 & 0x1f) == 0) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
        std::ostream::put('h');
        std::ostream::flush();
      }
    } while (uVar11 != 0x7bf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"};",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    plVar9 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "const uint8_t kSmallPeelSeeds[kTinyTableCount + kSmallTableCount] = {",0x45);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar11 = 0;
    do {
      if ((uVar11 & 0x1f) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
      }
      poVar8 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,(uint)kSmallPeelSeeds[uVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
      uVar11 = uVar11 + 1;
      if ((uVar11 & 0x1f) == 0) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
        std::ostream::put('h');
        std::ostream::flush();
      }
    } while (uVar11 != 0x800);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"};",2);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    iVar3 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"GF256 init failed",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

void FillTables()
{
    memcpy(kTinyDenseCounts, wirehair::kTinyDenseCounts, sizeof(kTinyDenseCounts));
    memcpy(kTinyDenseSeeds, wirehair::kTinyDenseSeeds, sizeof(kTinyDenseSeeds));
    memcpy(kSmallDenseSeeds, wirehair::kSmallDenseSeeds, sizeof(kSmallDenseSeeds));
    memcpy(kSmallPeelSeeds, wirehair::kSmallPeelSeeds, sizeof(kSmallPeelSeeds));
}